

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O2

void __thiscall
Engine_testConstructAddHandler_Test::TestBody(Engine_testConstructAddHandler_Test *this)

{
  __uniq_ptr_impl<Handler,_std::default_delete<Handler>_> _Var1;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  *pvVar2;
  char *pcVar3;
  AssertHelper local_70;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertionResult gtest_ar;
  _Head_base<0UL,_Handler_*,_false> local_50;
  Engine e;
  
  Engine::Engine(&e,"foo");
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"foo\"","e.prefix",(char (*) [4])0x166245,&e.prefix);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
               ,0x28,pcVar3);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_70.data_ = local_70.data_ & 0xffffffff00000000;
    pvVar2 = Engine::GetHandlers(&e);
    local_68.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)(pvVar2->
                super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(pvVar2->
                super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 3);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&gtest_ar,"0","e.GetHandlers().size()",(int *)&local_70,
               (unsigned_long *)&local_68);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_68);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x29,pcVar3);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      std::make_unique<PrintHandler>();
      local_50._M_head_impl = (Handler *)gtest_ar._0_8_;
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
      Engine::RegisterHandler(&e,(unique_ptr<Handler,_std::default_delete<Handler>_> *)&local_50);
      if (local_50._M_head_impl != (Handler *)0x0) {
        (*(local_50._M_head_impl)->_vptr_Handler[3])();
      }
      local_50._M_head_impl = (Handler *)0x0;
      if (gtest_ar._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 0x18))();
      }
      local_70.data_._0_4_ = 1;
      pvVar2 = Engine::GetHandlers(&e);
      local_68.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)(pvVar2->
                  super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(pvVar2->
                  super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3);
      testing::internal::CmpHelperEQ<int,unsigned_long>
                ((internal *)&gtest_ar,"1","e.GetHandlers().size()",(int *)&local_70,
                 (unsigned_long *)&local_68);
      if (gtest_ar.success_ != false) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        local_68.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        pvVar2 = Engine::GetHandlers(&e);
        _Var1._M_t.super__Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>.
        super__Head_base<0UL,_Handler_*,_false>._M_head_impl =
             (((pvVar2->
               super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<Handler,_std::default_delete<Handler>_>._M_t;
        if ((_Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>)
            _Var1._M_t.super__Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>.
            super__Head_base<0UL,_Handler_*,_false>._M_head_impl == (Handler *)0x0) {
          local_70.data_ = (AssertHelperData *)0x0;
        }
        else {
          local_70.data_ =
               (AssertHelperData *)
               __dynamic_cast(_Var1._M_t.
                              super__Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>.
                              super__Head_base<0UL,_Handler_*,_false>._M_head_impl,
                              &Handler::typeinfo,&PrintHandler::typeinfo,0);
        }
        testing::internal::CmpHelperNE<decltype(nullptr),PrintHandler*>
                  ((internal *)&gtest_ar,"nullptr",
                   "dynamic_cast<PrintHandler *>(e.GetHandlers()[0].get())",&local_68.ptr_,
                   (PrintHandler **)&local_70);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_68);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_70,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                     ,0x2c,pcVar3);
          testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
          testing::internal::AssertHelper::~AssertHelper(&local_70);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&local_68);
        }
        goto LAB_001123ad;
      }
      testing::Message::Message((Message *)&local_68);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x2b,pcVar3);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_70);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_68);
LAB_001123ad:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  Engine::~Engine(&e);
  return;
}

Assistant:

TEST(Engine, testConstructAddHandler) {
    Engine e("foo");
    ASSERT_EQ("foo", e.prefix);
    ASSERT_EQ(0, e.GetHandlers().size());
    e.RegisterHandler(std::move(std::make_unique<PrintHandler>()));
    ASSERT_EQ(1, e.GetHandlers().size());
    ASSERT_NE(nullptr, dynamic_cast<PrintHandler *>(e.GetHandlers()[0].get()));
}